

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O0

void __thiscall cmParseCacheCoverage::RemoveUnCoveredFiles(cmParseCacheCoverage *this)

{
  cmCTest *this_00;
  cmCTestCoverageHandlerContainer *pcVar1;
  bool bVar2;
  pointer ppVar3;
  reference piVar4;
  ostream *poVar5;
  char *msg;
  _Self __position;
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream cmCTestLog_msg;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  iterator i;
  bool nothing;
  SingleFileCoverageVector *v;
  _Self local_18;
  iterator ci;
  cmParseCacheCoverage *this_local;
  
  ci._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::begin(&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage);
  do {
    v = (SingleFileCoverageVector *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::end(&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage);
    bVar2 = std::operator!=(&local_18,(_Self *)&v);
    if (!bVar2) {
      return;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator->(&local_18);
    i._M_current._7_1_ = 1;
    local_38._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar3->second);
    while( true ) {
      local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar3->second);
      bVar2 = __gnu_cxx::operator!=(&local_38,&local_40);
      if (!bVar2) break;
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_38);
      if (0 < *piVar4) {
        i._M_current._7_1_ = 0;
        break;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_38);
    }
    if ((i._M_current._7_1_ & 1) == 0) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&local_18);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar5 = std::operator<<((ostream *)local_1b8,"No coverage found in: ");
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_18);
      poVar5 = std::operator<<(poVar5,(string *)ppVar3);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_00 = (this->super_cmParseMumpsCoverage).CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_00,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                   ,0x4c,msg,(bool)(((this->super_cmParseMumpsCoverage).Coverage)->Quiet & 1));
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
      pcVar1 = (this->super_cmParseMumpsCoverage).Coverage;
      __position = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator++(&local_18,0);
      std::
      map<std::__cxx11::string,std::vector<int,std::allocator<int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
      ::erase_abi_cxx11_((map<std::__cxx11::string,std::vector<int,std::allocator<int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                          *)&pcVar1->TotalCoverage,(iterator)__position._M_node);
    }
  } while( true );
}

Assistant:

void cmParseCacheCoverage::RemoveUnCoveredFiles()
{
  // loop over the coverage data computed and remove all files
  // that only have -1 or 0 for the lines.
  cmCTestCoverageHandlerContainer::TotalCoverageMap::iterator ci =
    this->Coverage.TotalCoverage.begin();
  while(ci != this->Coverage.TotalCoverage.end())
    {
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector& v =
      ci->second;
    bool nothing = true;
    for(cmCTestCoverageHandlerContainer::SingleFileCoverageVector::iterator i=
          v.begin(); i != v.end(); ++i)
      {
      if(*i > 0)
        {
        nothing = false;
        break;
        }
      }
    if(nothing)
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "No coverage found in: " << ci->first
                 << std::endl, this->Coverage.Quiet);
      this->Coverage.TotalCoverage.erase(ci++);
      }
    else
      {
      ++ci;
      }
    }
}